

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift_helper_template.h
# Opt level: O2

target_ulong helper_rclq_x86_64(CPUX86State *env,target_ulong t0,target_ulong t1)

{
  char cVar1;
  ulong uVar2;
  target_ulong tVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = (uint)t1 & 0x3f;
  tVar3 = t0;
  if ((t1 & 0x3f) != 0) {
    uVar5 = (uint)env->cc_src;
    cVar1 = (char)uVar4;
    uVar2 = 0;
    if (uVar4 != 1) {
      uVar2 = t0 >> (0x41U - cVar1 & 0x3f);
    }
    uVar2 = uVar2 | t0 << ((byte)t1 & 0x3f);
    tVar3 = (ulong)(uVar5 & 1) << (cVar1 - 1U & 0x3f) | uVar2;
    env->cc_src = (ulong)((t0 >> ((ulong)(byte)(0x40 - cVar1) & 0x3f) & 1) != 0) |
                  (long)(int)uVar5 & 0xfffffffffffff7feU |
                  (ulong)(((uint)(uVar2 >> 0x20) ^ (uint)(t0 >> 0x20)) >> 0x14 & 0x800);
  }
  return tVar3;
}

Assistant:

target_ulong glue(helper_rcl, SUFFIX)(CPUX86State *env, target_ulong t0,
                                      target_ulong t1)
{
    int count, eflags;
    target_ulong src;
    target_long res;

    count = t1 & SHIFT1_MASK;
#if DATA_BITS == 16
    count = rclw_table[count];
#elif DATA_BITS == 8
    count = rclb_table[count];
#endif
    if (count) {
        eflags = (int)env->cc_src;
        t0 &= DATA_MASK;
        src = t0;
        res = (t0 << count) | ((target_ulong)(eflags & CC_C) << (count - 1));
        if (count > 1) {
            res |= t0 >> (DATA_BITS + 1 - count);
        }
        t0 = res;
        env->cc_src = (eflags & ~(CC_C | CC_O)) |
            (lshift(src ^ t0, 11 - (DATA_BITS - 1)) & CC_O) |
            ((src >> (DATA_BITS - count)) & CC_C);
    }
    return t0;
}